

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proj.c
# Opt level: O2

void project(OSQPWorkspace *work,c_float *z)

{
  OSQPData *pOVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  pOVar1 = work->data;
  lVar3 = 0;
  lVar2 = pOVar1->m;
  if (pOVar1->m < 1) {
    lVar2 = lVar3;
  }
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    dVar4 = z[lVar3];
    if (z[lVar3] <= pOVar1->l[lVar3]) {
      dVar4 = pOVar1->l[lVar3];
    }
    if (pOVar1->u[lVar3] <= dVar4) {
      dVar4 = pOVar1->u[lVar3];
    }
    z[lVar3] = dVar4;
  }
  return;
}

Assistant:

void project(OSQPWorkspace *work, c_float *z) {
  c_int i, m;

  m = work->data->m;

  for (i = 0; i < m; i++) {
    z[i] = c_min(c_max(z[i],
                       work->data->l[i]), // Between lower
                 work->data->u[i]);       // and upper bounds
  }
}